

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContextOptimizationOverrideInfo.cpp
# Opt level: O1

void __thiscall
Js::ScriptContextOptimizationOverrideInfo::Merge
          (ScriptContextOptimizationOverrideInfo *this,ScriptContextOptimizationOverrideInfo *info)

{
  ScriptContextOptimizationOverrideInfo **ppSVar1;
  ScriptContextOptimizationOverrideInfo *pSVar2;
  code *pcVar3;
  bool bVar4;
  undefined4 *puVar5;
  ScriptContextOptimizationOverrideInfo *pSVar6;
  ScriptContextOptimizationOverrideInfo *pSVar7;
  ScriptContextOptimizationOverrideInfo *this_00;
  
  pSVar7 = this->crossSiteRoot;
  pSVar2 = info->crossSiteRoot;
  if (pSVar7 == pSVar2) {
    if (pSVar7 != (ScriptContextOptimizationOverrideInfo *)0x0) {
      return;
    }
    if (info->arraySetElementFastPathVtable == 1) {
      DisableArraySetElementFastPath(this);
    }
    this->sideEffects = this->sideEffects | info->sideEffects;
    this->crossSiteRoot = this;
    this->crossSitePrev = this;
    this->crossSiteNext = this;
    this_00 = this;
  }
  else {
    this_00 = pSVar7;
    if (pSVar7 == (ScriptContextOptimizationOverrideInfo *)0x0) {
      info = this;
      this_00 = pSVar2;
    }
    if (info->arraySetElementFastPathVtable == 1) {
      DisableArraySetElementFastPath(this_00);
    }
    this_00->sideEffects = this_00->sideEffects | info->sideEffects;
    pSVar6 = this_00;
    if (this_00->crossSiteRoot == (ScriptContextOptimizationOverrideInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                  ,0x2b,"(crossSiteRoot != nullptr)","crossSiteRoot != nullptr");
      if (!bVar4) goto LAB_007b3318;
      *puVar5 = 0;
    }
    do {
      pSVar6->arraySetElementFastPathVtable = this_00->arraySetElementFastPathVtable;
      pSVar6->intArraySetElementFastPathVtable = this_00->intArraySetElementFastPathVtable;
      pSVar6->floatArraySetElementFastPathVtable = this_00->floatArraySetElementFastPathVtable;
      pSVar6->sideEffects = this_00->sideEffects;
      ppSVar1 = &pSVar6->crossSiteNext;
      pSVar6 = *ppSVar1;
    } while (*ppSVar1 != this_00);
    if (pSVar7 != (ScriptContextOptimizationOverrideInfo *)0x0 &&
        pSVar2 != (ScriptContextOptimizationOverrideInfo *)0x0) {
      pSVar7 = info;
      if (info->crossSiteRoot == (ScriptContextOptimizationOverrideInfo *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar5 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/ScriptContextOptimizationOverrideInfo.cpp"
                                    ,0x39,"(crossSiteRoot != nullptr)","crossSiteRoot != nullptr");
        if (!bVar4) {
LAB_007b3318:
          pcVar3 = (code *)invalidInstructionException();
          (*pcVar3)();
        }
        *puVar5 = 0;
      }
      do {
        pSVar2 = pSVar7->crossSiteNext;
        Insert(this_00,pSVar7);
        pSVar7 = pSVar2;
      } while (pSVar2 != info);
      goto LAB_007b3302;
    }
  }
  Insert(this_00,info);
LAB_007b3302:
  Verify(this);
  return;
}

Assistant:

void
ScriptContextOptimizationOverrideInfo::Merge(ScriptContextOptimizationOverrideInfo * info)
{
    ScriptContextOptimizationOverrideInfo * thisRoot = this->crossSiteRoot;
    ScriptContextOptimizationOverrideInfo * infoRoot = info->crossSiteRoot;
    if (thisRoot == infoRoot)
    {
        if (thisRoot != nullptr)
        {
            // Both info is already in the same info group
            return;
        }

        // Both of them are null, just group them

        // Update this to be the template
        this->Update(info);

        // Initialize the cross site list
        this->crossSiteRoot = this;
        this->crossSitePrev = this;
        this->crossSiteNext = this;

        // Insert the info to the list
        this->Insert(info);
    }
    else
    {
        if (thisRoot == nullptr)
        {
            thisRoot = infoRoot;
            infoRoot = nullptr;
            info = this;
        }

        thisRoot->Update(info);

        // Spread the information on the current group
        thisRoot->ForEachCrossSiteInfo([thisRoot](ScriptContextOptimizationOverrideInfo * i)
        {
            thisRoot->CopyTo(i);
        });

        if (infoRoot == nullptr)
        {
            thisRoot->Insert(info);
        }
        else
        {
            // Insert the other group
            info->ForEachEditingCrossSiteInfo([thisRoot](ScriptContextOptimizationOverrideInfo * i)
            {
                thisRoot->Insert(i);
            });
        }
    }

    DebugOnly(Verify());
}